

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O0

TestCaseGroup * vkt::tessellation::createPrimitiveDiscardTests(TestContext *testCtx)

{
  CaseDefinition arg0;
  bool bVar1;
  TestCaseGroup *pTVar2;
  char *pcVar3;
  bool bVar4;
  allocator<char> local_179;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string caseName;
  CaseDefinition caseDef;
  int lessThanOneInnerLevelsNdx;
  int usePointModeNdx;
  int windingNdx;
  int spacingModeNdx;
  int primitiveTypeNdx;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"primitive_discard",
             "Test primitive discard with relevant outer tessellation level <= 0.0");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&spacingModeNdx + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  for (windingNdx = 0; windingNdx < 3; windingNdx = windingNdx + 1) {
    for (usePointModeNdx = 0; usePointModeNdx < 3; usePointModeNdx = usePointModeNdx + 1) {
      for (lessThanOneInnerLevelsNdx = 0; lessThanOneInnerLevelsNdx < 2;
          lessThanOneInnerLevelsNdx = lessThanOneInnerLevelsNdx + 1) {
        caseDef.usePointMode = false;
        caseDef.useLessThanOneInnerLevels = false;
        caseDef._14_2_ = 0;
        for (; (int)caseDef._12_4_ < 2; caseDef._12_4_ = caseDef._12_4_ + 1) {
          for (caseDef.winding = WINDING_CCW; (int)caseDef.winding < 2;
              caseDef.winding = caseDef.winding + WINDING_CW) {
            caseName.field_2._12_4_ = windingNdx;
            bVar4 = caseDef.winding != WINDING_CCW;
            bVar1 = anon_unknown_0::lessThanOneInnerLevelsDefined
                              ((CaseDefinition *)((long)&caseName.field_2 + 0xc));
            if ((!bVar1) || (bVar4)) {
              std::__cxx11::string::string((string *)&local_158);
              pcVar3 = getTessPrimitiveTypeShaderName(caseName.field_2._12_4_);
              std::operator+(&local_138,&local_158,pcVar3);
              std::operator+(&local_118,&local_138,"_");
              pcVar3 = getSpacingModeShaderName(usePointModeNdx);
              std::operator+(&local_f8,&local_118,pcVar3);
              std::operator+(&local_d8,&local_f8,"_");
              pcVar3 = getWindingShaderName(lessThanOneInnerLevelsNdx);
              std::operator+(&local_b8,&local_d8,pcVar3);
              pcVar3 = "";
              if (caseDef._12_4_ != 0) {
                pcVar3 = "_point_mode";
              }
              std::operator+(&local_98,&local_b8,pcVar3);
              pcVar3 = "_valid_levels";
              if (bVar4) {
                pcVar3 = "";
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_78,&local_98,pcVar3);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_b8);
              std::__cxx11::string::~string((string *)&local_d8);
              std::__cxx11::string::~string((string *)&local_f8);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&local_138);
              std::__cxx11::string::~string((string *)&local_158);
              pTVar2 = de::details::
                       UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                                 ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                   *)local_20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"",&local_179)
              ;
              arg0.spacingMode = usePointModeNdx;
              arg0.primitiveType = caseName.field_2._12_4_;
              arg0.usePointMode = caseDef._12_4_ != 0;
              arg0.winding = lessThanOneInnerLevelsNdx;
              arg0.useLessThanOneInnerLevels = bVar4;
              arg0._14_2_ = caseDef.spacingMode._2_2_;
              addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
                        (pTVar2,(string *)local_78,&local_178,anon_unknown_0::initPrograms,
                         anon_unknown_0::test,arg0);
              std::__cxx11::string::~string((string *)&local_178);
              std::allocator<char>::~allocator(&local_179);
              std::__cxx11::string::~string((string *)local_78);
            }
          }
        }
      }
    }
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createPrimitiveDiscardTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "primitive_discard", "Test primitive discard with relevant outer tessellation level <= 0.0"));

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; primitiveTypeNdx++)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; spacingModeNdx++)
	for (int windingNdx = 0; windingNdx < WINDING_LAST; windingNdx++)
	for (int usePointModeNdx = 0; usePointModeNdx <= 1; usePointModeNdx++)
	for (int lessThanOneInnerLevelsNdx = 0; lessThanOneInnerLevelsNdx <= 1; lessThanOneInnerLevelsNdx++)
	{
		const CaseDefinition caseDef =
		{
			(TessPrimitiveType)primitiveTypeNdx,
			(SpacingMode)spacingModeNdx,
			(Winding)windingNdx,
			(usePointModeNdx != 0),
			(lessThanOneInnerLevelsNdx != 0)
		};

		if (lessThanOneInnerLevelsDefined(caseDef) && !caseDef.useLessThanOneInnerLevels)
			continue; // No point generating a separate case as <= 1 inner level behavior is well-defined

		const std::string caseName = std::string() + getTessPrimitiveTypeShaderName(caseDef.primitiveType)
									 + "_" + getSpacingModeShaderName(caseDef.spacingMode)
									 + "_" + getWindingShaderName(caseDef.winding)
									 + (caseDef.usePointMode ? "_point_mode" : "")
									 + (caseDef.useLessThanOneInnerLevels ? "" : "_valid_levels");

		addFunctionCaseWithPrograms(group.get(), caseName, "", initPrograms, test, caseDef);
	}

	return group.release();
}